

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<slang::ast::HierarchicalReference::Element>::reallocateTo
          (SmallVectorBase<slang::ast::HierarchicalReference::Element> *this,size_type newCapacity)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer p;
  size_type sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer pEVar7;
  long lVar8;
  
  pEVar7 = (pointer)operator_new(newCapacity << 5);
  p = this->data_;
  sVar3 = this->len;
  if (sVar3 != 0) {
    lVar8 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(p->symbol).ptr + lVar8);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)&(p->selector).
                       super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       .
                       super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
               + lVar8 + 8);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)&(pEVar7->selector).
                       super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       .
                       super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
               + lVar8 + 8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      puVar1 = (undefined8 *)((long)&(pEVar7->symbol).ptr + lVar8);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      lVar8 = lVar8 + 0x20;
    } while (sVar3 << 5 != lVar8);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->cap = newCapacity;
  this->data_ = pEVar7;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }